

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O1

void __thiscall
fasttext::Model::dfs
          (Model *this,int32_t k,int32_t node,real score,
          vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *heap,
          Vector *hidden)

{
  pointer *pppVar1;
  float fVar2;
  int32_t node_00;
  int iVar3;
  pointer ppVar4;
  iterator __position;
  pointer pNVar5;
  pointer ppVar6;
  bool bVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  real rVar12;
  double dVar13;
  pair<float,_int> local_38;
  
  while( true ) {
    ppVar4 = (heap->
             super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    __position._M_current =
         (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (((long)__position._M_current - (long)ppVar4 >> 3 == (long)k) && (score < ppVar4->first)) {
      return;
    }
    lVar8 = (long)node;
    pNVar5 = (this->tree).super__Vector_base<fasttext::Node,_std::allocator<fasttext::Node>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((pNVar5[lVar8].left == -1) && (pNVar5[lVar8].right == -1)) break;
    rVar12 = Matrix::dotRow((this->wo_).
                            super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            hidden,lVar8 - this->osz_);
    rVar12 = utils::sigmoid(rVar12);
    node_00 = (this->tree).super__Vector_base<fasttext::Node,_std::allocator<fasttext::Node>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar8].left;
    dVar13 = utils::log((double)(ulong)(uint)(1.0 - rVar12));
    dfs(this,k,node_00,SUB84(dVar13,0) + score,heap,hidden);
    node = (this->tree).super__Vector_base<fasttext::Node,_std::allocator<fasttext::Node>_>._M_impl.
           super__Vector_impl_data._M_start[lVar8].right;
    dVar13 = utils::log((double)(ulong)(uint)rVar12);
    score = SUB84(dVar13,0) + score;
  }
  if (__position._M_current ==
      (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_38.first = score;
    local_38.second = node;
    std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>::
    _M_realloc_insert<std::pair<float,int>>
              ((vector<std::pair<float,int>,std::allocator<std::pair<float,int>>> *)heap,__position,
               &local_38);
  }
  else {
    (__position._M_current)->first = score;
    (__position._M_current)->second = node;
    pppVar1 = &(heap->
               super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    *pppVar1 = *pppVar1 + 1;
  }
  ppVar4 = (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  fVar2 = ppVar4[-1].first;
  ppVar6 = (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  iVar3 = ppVar4[-1].second;
  uVar9 = (long)ppVar4 - (long)ppVar6 >> 3;
  lVar8 = uVar9 - 1;
  if (1 < (long)uVar9) {
    do {
      lVar10 = (lVar8 - (lVar8 + -1 >> 0x3f)) + -1 >> 1;
      if (ppVar6[lVar10].first <= fVar2) break;
      ppVar6[lVar8].first = ppVar6[lVar10].first;
      ppVar6[lVar8].second = ppVar6[lVar10].second;
      bVar7 = 2 < lVar8;
      lVar8 = lVar10;
    } while (bVar7);
  }
  ppVar6[lVar8].first = fVar2;
  ppVar6[lVar8].second = iVar3;
  if ((ulong)(long)k < uVar9) {
    if (8 < (long)ppVar4 - (long)ppVar6) {
      fVar2 = ppVar4[-1].first;
      iVar3 = ppVar4[-1].second;
      ppVar4[-1].first = ppVar6->first;
      ppVar4[-1].second = ppVar6->second;
      uVar9 = (long)(ppVar4 + -1) - (long)ppVar6;
      lVar8 = (long)uVar9 >> 3;
      if (lVar8 < 3) {
        lVar10 = 0;
      }
      else {
        lVar11 = 0;
        do {
          if (ppVar6[lVar11 * 2 + 1].first < ppVar6[lVar11 * 2 + 2].first) {
            lVar10 = lVar11 * 2 + 1;
          }
          else {
            lVar10 = lVar11 * 2 + 2;
          }
          ppVar6[lVar11].first = ppVar6[lVar10].first;
          ppVar6[lVar11].second = ppVar6[lVar10].second;
          lVar11 = lVar10;
        } while (lVar10 < (lVar8 - (lVar8 + -1 >> 0x3f)) + -1 >> 1);
      }
      if (((uVar9 & 8) == 0) && (lVar10 == lVar8 + -2 >> 1)) {
        ppVar6[lVar10].first = ppVar6[lVar10 * 2 + 1].first;
        ppVar6[lVar10].second = ppVar6[lVar10 * 2 + 1].second;
        lVar10 = lVar10 * 2 + 1;
      }
      if (0 < lVar10) {
        do {
          lVar8 = (lVar10 - (lVar10 + -1 >> 0x3f)) + -1 >> 1;
          if (ppVar6[lVar8].first <= fVar2) break;
          ppVar6[lVar10].first = ppVar6[lVar8].first;
          ppVar6[lVar10].second = ppVar6[lVar8].second;
          bVar7 = 2 < lVar10;
          lVar10 = lVar8;
        } while (bVar7);
      }
      ppVar6[lVar10].first = fVar2;
      ppVar6[lVar10].second = iVar3;
    }
    (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
    _M_impl.super__Vector_impl_data._M_finish = ppVar4 + -1;
  }
  return;
}

Assistant:

void Model::dfs(int32_t k, int32_t node, real score,
                std::vector<std::pair<real, int32_t>>& heap,
                Vector& hidden) const {
  if (heap.size() == k && score < heap.front().first) {
    return;
  }

  if (tree[node].left == -1 && tree[node].right == -1) {
    heap.push_back(std::make_pair(score, node));
    std::push_heap(heap.begin(), heap.end(), comparePairs);
    if (heap.size() > k) {
      std::pop_heap(heap.begin(), heap.end(), comparePairs);
      heap.pop_back();
    }
    return;
  }

  real f = utils::sigmoid(wo_->dotRow(hidden, node - osz_));
  dfs(k, tree[node].left, score + utils::log(1.0 - f), heap, hidden);
  dfs(k, tree[node].right, score + utils::log(f), heap, hidden);
}